

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void filter_frame_on_unit
               (RestorationTileLimits *limits,int rest_unit_idx,void *priv,int32_t *tmpbuf,
               RestorationLineBuffers *rlbs,aom_internal_error_info *error_info)

{
  RestorationLineBuffers *unaff_RBX;
  undefined8 in_RDI;
  RestorationStripeBoundaries *unaff_R12;
  RestorationUnitInfo *unaff_R13;
  RestorationTileLimits *unaff_R14;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  uint8_t *in_stack_00000030;
  int in_stack_00000038;
  uint8_t *in_stack_00000040;
  int in_stack_00000048;
  int32_t *in_stack_00000050;
  int in_stack_00000058;
  aom_internal_error_info *in_stack_00000060;
  RestorationInfo *rsi;
  FilterFrameCtxt *ctxt;
  
  av1_loop_restoration_filter_unit
            (unaff_R14,unaff_R13,unaff_R12,unaff_RBX,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
             in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048,
             in_stack_00000050,in_stack_00000058,in_stack_00000060);
  return;
}

Assistant:

static void filter_frame_on_unit(const RestorationTileLimits *limits,
                                 int rest_unit_idx, void *priv, int32_t *tmpbuf,
                                 RestorationLineBuffers *rlbs,
                                 struct aom_internal_error_info *error_info) {
  FilterFrameCtxt *ctxt = (FilterFrameCtxt *)priv;
  const RestorationInfo *rsi = ctxt->rsi;

  av1_loop_restoration_filter_unit(
      limits, &rsi->unit_info[rest_unit_idx], &rsi->boundaries, rlbs,
      ctxt->plane_w, ctxt->plane_h, ctxt->ss_x, ctxt->ss_y, ctxt->highbd,
      ctxt->bit_depth, ctxt->data8, ctxt->data_stride, ctxt->dst8,
      ctxt->dst_stride, tmpbuf, rsi->optimized_lr, error_info);
}